

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

ModuleRecordList * __thiscall Js::JavascriptLibrary::EnsureModuleRecordList(JavascriptLibrary *this)

{
  Type *addr;
  Type pRVar1;
  Recycler *alloc;
  List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar2;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  addr = &this->moduleRecordList;
  if ((this->moduleRecordList).ptr ==
      (List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    local_50 = (undefined1  [8])
               &JsUtil::
                List<Js::SourceTextModuleRecord*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>
                ::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_766a001;
    data.filename._0_4_ = 0x1c95;
    alloc = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_50);
    pLVar2 = (List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              *)new<Memory::Recycler>(0x30,alloc,0x38bbb2);
    pRVar1 = this->recycler;
    (pLVar2->super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>).
    buffer.ptr = (WriteBarrierPtr<Js::SourceTextModuleRecord> *)0x0;
    (pLVar2->super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>).
    count = 0;
    (pLVar2->super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>).
    alloc = pRVar1;
    (pLVar2->super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>).
    _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_015012d0;
    pLVar2->length = 0;
    pLVar2->increment = 4;
    Memory::Recycler::WBSetBit((char *)addr);
    (this->moduleRecordList).ptr = pLVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  }
  return addr->ptr;
}

Assistant:

ModuleRecordList* JavascriptLibrary::EnsureModuleRecordList()
    {
        if (moduleRecordList == nullptr)
        {
            moduleRecordList = RecyclerNew(recycler, ModuleRecordList, recycler);
        }
        return moduleRecordList;
    }